

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineComputer.cxx
# Opt level: O2

void __thiscall
cmLinkLineComputer::ComputeLinkLibs
          (cmLinkLineComputer *this,cmComputeLinkInformation *cli,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  TargetType TVar1;
  ItemVector *pIVar2;
  pointer this_00;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> linkLib;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_118;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_100;
  pointer local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_90;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  local_100 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
              linkLibraries;
  pIVar2 = cmComputeLinkInformation::GetItems(cli);
  this_00 = (pIVar2->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_f8 = (pIVar2->
             super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == local_f8) {
      return;
    }
    if (this_00->Target == (cmGeneratorTarget *)0x0) {
LAB_002cf443:
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_118.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_118.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_118);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&local_90,&local_f0,(cmListFileBacktrace *)&local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_118.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_f0);
      if (this_00->IsPath == Yes) {
        (*this->_vptr_cmLinkLineComputer[2])(&local_d0,this,this_00);
        ConvertToOutputFormat(&local_b0,this,&local_d0);
        cmComputeLinkInformation::Item::GetFormattedItem(&local_60,this_00,&local_b0);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=(&local_90,&local_60);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_60);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      else {
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator=(&local_90,&this_00->Value);
      }
      std::__cxx11::string::append((char *)&local_90);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>&>(local_100,&local_90);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&local_90);
    }
    else {
      TVar1 = cmGeneratorTarget::GetType(this_00->Target);
      if (TVar1 != INTERFACE_LIBRARY) {
        TVar1 = cmGeneratorTarget::GetType(this_00->Target);
        if (TVar1 != OBJECT_LIBRARY) goto LAB_002cf443;
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void cmLinkLineComputer::ComputeLinkLibs(
  cmComputeLinkInformation& cli, std::vector<BT<std::string>>& linkLibraries)
{
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  for (auto const& item : items) {
    if (item.Target &&
        (item.Target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
         item.Target->GetType() == cmStateEnums::OBJECT_LIBRARY)) {
      continue;
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      linkLib = item.GetFormattedItem(this->ConvertToOutputFormat(
        this->ConvertToLinkReference(item.Value.Value)));
    } else {
      linkLib = item.Value;
    }
    linkLib.Value += " ";

    linkLibraries.emplace_back(linkLib);
  }
}